

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_reader.cc
# Opt level: O2

uint __thiscall leveldb::log::Reader::ReadPhysicalRecord(Reader *this,Slice *result)

{
  char cVar1;
  ushort uVar2;
  int iVar3;
  int *piVar4;
  Status SVar5;
  uint32_t uVar6;
  int *piVar7;
  char *reason;
  ulong uVar8;
  ulong uVar9;
  Status status;
  
  do {
    uVar8 = (this->buffer_).size_;
    if (6 < uVar8) {
      piVar4 = (int *)(this->buffer_).data_;
      uVar2 = *(ushort *)(piVar4 + 1);
      uVar9 = (ulong)(uVar2 + 7);
      if (uVar8 < uVar9) {
        (this->buffer_).data_ = "";
        (this->buffer_).size_ = 0;
        if (this->eof_ != false) {
          return 5;
        }
        reason = "bad record length";
LAB_001101d7:
        ReportCorruption(this,uVar8,reason);
      }
      else {
        cVar1 = *(char *)((long)piVar4 + 6);
        if ((cVar1 == '\0') && (uVar2 == 0)) {
          (this->buffer_).data_ = "";
          (this->buffer_).size_ = 0;
          return 6;
        }
        piVar7 = piVar4;
        if (this->checksum_ == true) {
          iVar3 = *piVar4;
          uVar6 = crc32c::Value((char *)((long)piVar4 + 6),(ulong)(uVar2 + 1));
          if (uVar6 != ((iVar3 + 0x5d7d1528U) * 0x8000 | iVar3 + 0x5d7d1528U >> 0x11)) {
            uVar8 = (this->buffer_).size_;
            (this->buffer_).data_ = "";
            (this->buffer_).size_ = 0;
            reason = "checksum mismatch";
            goto LAB_001101d7;
          }
          piVar7 = (int *)(this->buffer_).data_;
          uVar8 = (this->buffer_).size_;
        }
        (this->buffer_).data_ = (char *)((long)piVar7 + uVar9);
        (this->buffer_).size_ = uVar8 - uVar9;
        if (this->initial_offset_ <=
            (this->end_of_buffer_offset_ - ((uVar8 - uVar9) + (ulong)uVar2)) - 7) {
          result->data_ = (char *)((long)piVar4 + 7);
          result->size_ = (ulong)uVar2;
          return (int)cVar1;
        }
        result->data_ = "";
        result->size_ = 0;
      }
      return 6;
    }
    (this->buffer_).data_ = "";
    (this->buffer_).size_ = 0;
    if (this->eof_ != false) {
      return 5;
    }
    (*this->file_->_vptr_SequentialFile[2])
              (&status,this->file_,0x8000,&this->buffer_,this->backing_store_);
    SVar5 = status;
    uVar8 = (this->buffer_).size_;
    this->end_of_buffer_offset_ = this->end_of_buffer_offset_ + uVar8;
    if (status.state_ == (char *)0x0) {
      if (uVar8 < 0x8000) goto LAB_00110192;
    }
    else {
      (this->buffer_).data_ = "";
      (this->buffer_).size_ = 0;
      ReportDrop(this,0x8000,&status);
LAB_00110192:
      this->eof_ = true;
    }
    Status::~Status(&status);
    if (SVar5.state_ != (char *)0x0) {
      return 5;
    }
  } while( true );
}

Assistant:

unsigned int Reader::ReadPhysicalRecord(Slice* result) {
  while (true) {
    if (buffer_.size() < kHeaderSize) {
      if (!eof_) {
        // Last read was a full read, so this is a trailer to skip
        buffer_.clear();
        Status status = file_->Read(kBlockSize, &buffer_, backing_store_);
        end_of_buffer_offset_ += buffer_.size();
        if (!status.ok()) {
          buffer_.clear();
          ReportDrop(kBlockSize, status);
          eof_ = true;
          return kEof;
        } else if (buffer_.size() < kBlockSize) {
          eof_ = true;
        }
        continue;
      } else {
        // Note that if buffer_ is non-empty, we have a truncated header at the
        // end of the file, which can be caused by the writer crashing in the
        // middle of writing the header. Instead of considering this an error,
        // just report EOF.
        buffer_.clear();
        return kEof;
      }
    }

    // Parse the header
    const char* header = buffer_.data();
    const uint32_t a = static_cast<uint32_t>(header[4]) & 0xff;
    const uint32_t b = static_cast<uint32_t>(header[5]) & 0xff;
    const unsigned int type = header[6];
    const uint32_t length = a | (b << 8);
    if (kHeaderSize + length > buffer_.size()) {
      size_t drop_size = buffer_.size();
      buffer_.clear();
      if (!eof_) {
        ReportCorruption(drop_size, "bad record length");
        return kBadRecord;
      }
      // If the end of the file has been reached without reading |length| bytes
      // of payload, assume the writer died in the middle of writing the record.
      // Don't report a corruption.
      return kEof;
    }

    if (type == kZeroType && length == 0) {
      // Skip zero length record without reporting any drops since
      // such records are produced by the mmap based writing code in
      // env_posix.cc that preallocates file regions.
      buffer_.clear();
      return kBadRecord;
    }

    // Check crc
    if (checksum_) {
      uint32_t expected_crc = crc32c::Unmask(DecodeFixed32(header));
      uint32_t actual_crc = crc32c::Value(header + 6, 1 + length);
      if (actual_crc != expected_crc) {
        // Drop the rest of the buffer since "length" itself may have
        // been corrupted and if we trust it, we could find some
        // fragment of a real log record that just happens to look
        // like a valid log record.
        size_t drop_size = buffer_.size();
        buffer_.clear();
        ReportCorruption(drop_size, "checksum mismatch");
        return kBadRecord;
      }
    }

    buffer_.remove_prefix(kHeaderSize + length);

    // Skip physical record that started before initial_offset_
    if (end_of_buffer_offset_ - buffer_.size() - kHeaderSize - length <
        initial_offset_) {
      result->clear();
      return kBadRecord;
    }

    *result = Slice(header + kHeaderSize, length);
    return type;
  }
}